

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O0

lattice_site __thiscall sisl::cartesian_cubic<float>::get_dimensions(cartesian_cubic<float> *this)

{
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *this_00;
  Index extraout_RDX;
  long in_RSI;
  lattice_site lVar1;
  Scalar local_5c;
  Scalar local_58 [5];
  Scalar local_44;
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> local_40;
  int local_20;
  undefined1 local_19;
  cartesian_cubic<float> *this_local;
  lattice_site *dims;
  
  local_19 = 0;
  local_20 = 3;
  this_local = this;
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix<int>((Matrix<int,__1,_1,_0,__1,_1> *)this,&local_20);
  local_44 = *(Scalar *)(in_RSI + 8);
  Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_40,(DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)this,&local_44);
  local_58[0] = *(Scalar *)(in_RSI + 0xc);
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_
                      (&local_40,local_58);
  local_5c = *(Scalar *)(in_RSI + 0x10);
  Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_(this_00,&local_5c);
  Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_40);
  lVar1.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = extraout_RDX;
  lVar1.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = (int *)this;
  return (lattice_site)lVar1.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

virtual const lattice_site get_dimensions() const {
            lattice_site dims(3);
            dims << _nx, _ny, _nz;
            return dims;
        }